

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

FString strbin1(char *start)

{
  char tail;
  char *pcVar1;
  char *in_RSI;
  int local_30;
  char local_29;
  int i;
  char c;
  char *p;
  char *start_local;
  FString *result;
  
  FString::FString((FString *)start);
  _i = in_RSI;
  do {
    while( true ) {
      pcVar1 = _i + 1;
      tail = *_i;
      if (tail == '\0') {
        return (FString)start;
      }
      _i = pcVar1;
      if (tail == '\\') break;
      FString::operator<<((FString *)start,tail);
    }
    switch(*pcVar1) {
    case '\n':
      break;
    default:
      FString::operator<<((FString *)start,*pcVar1);
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      local_29 = '\0';
      for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
        local_29 = local_29 * '\b';
        if ((*_i < '0') || ('7' < *_i)) {
          _i = _i + -1;
          break;
        }
        local_29 = local_29 + *_i + -0x30;
        _i = _i + 1;
      }
      FString::operator<<((FString *)start,local_29);
      break;
    case '?':
      FString::operator<<((FString *)start,'?');
      break;
    case 'X':
    case 'x':
      local_29 = '\0';
      for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
        pcVar1 = _i + 1;
        if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
          if ((*pcVar1 < 'a') || ('f' < *pcVar1)) {
            if ((*pcVar1 < 'A') || ('F' < *pcVar1)) break;
            local_29 = local_29 * '\x10' + *pcVar1 + -0x37;
          }
          else {
            local_29 = local_29 * '\x10' + *pcVar1 + -0x57;
          }
        }
        else {
          local_29 = local_29 * '\x10' + *pcVar1 + -0x30;
        }
        _i = pcVar1;
      }
      FString::operator<<((FString *)start,local_29);
      break;
    case 'a':
      FString::operator<<((FString *)start,'\a');
      break;
    case 'b':
      FString::operator<<((FString *)start,'\b');
      break;
    case 'c':
      FString::operator<<((FString *)start,'\x1c');
      break;
    case 'f':
      FString::operator<<((FString *)start,'\f');
      break;
    case 'n':
      FString::operator<<((FString *)start,'\n');
      break;
    case 'r':
      FString::operator<<((FString *)start,'\r');
      break;
    case 't':
      FString::operator<<((FString *)start,'\t');
      break;
    case 'v':
      FString::operator<<((FString *)start,'\v');
    }
    _i = _i + 1;
  } while( true );
}

Assistant:

FString strbin1 (const char *start)
{
	FString result;
	const char *p = start;
	char c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			result << c;
		} else {
			switch (*p) {
				case 'a':
					result << '\a';
					break;
				case 'b':
					result << '\b';
					break;
				case 'c':
					result << '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					result << '\f';
					break;
				case 'n':
					result << '\n';
					break;
				case 't':
					result << '\t';
					break;
				case 'r':
					result << '\r';
					break;
				case 'v':
					result << '\v';
					break;
				case '?':
					result << '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					result << c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
						{
							p--;
							break;
						}
						p++;
					}
					result << c;
					break;
				default:
					result << *p;
					break;
			}
			p++;
		}
	}
	return result;
}